

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  sqlite3_vtab_cursor *__s;
  Fts3auxCursor *pCsr;
  sqlite3_vtab_cursor **ppCsr_local;
  sqlite3_vtab *pVTab_local;
  
  __s = (sqlite3_vtab_cursor *)sqlite3_malloc(0xa8);
  if (__s == (sqlite3_vtab_cursor *)0x0) {
    pVTab_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0xa8);
    *ppCsr = __s;
    pVTab_local._4_4_ = 0;
  }
  return pVTab_local._4_4_;
}

Assistant:

static int fts3auxOpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  Fts3auxCursor *pCsr;            /* Pointer to cursor object to return */

  UNUSED_PARAMETER(pVTab);

  pCsr = (Fts3auxCursor *)sqlite3_malloc(sizeof(Fts3auxCursor));
  if( !pCsr ) return SQLITE_NOMEM;
  memset(pCsr, 0, sizeof(Fts3auxCursor));

  *ppCsr = (sqlite3_vtab_cursor *)pCsr;
  return SQLITE_OK;
}